

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t inlen)

{
  st_ptls_traffic_protection_t *enc;
  size_t sVar1;
  uint8_t *puVar2;
  size_t sVar3;
  ptls_buffer_t *buf;
  int iVar4;
  size_t sVar5;
  long lVar6;
  byte bVar7;
  size_t sVar8;
  ptls_message_emitter_t local_60;
  undefined8 local_38;
  
  if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x12d7,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  bVar7 = tls->field_0x160;
  if (0xffffff < (tls->traffic_protection).enc.seq) {
    bVar7 = bVar7 | 8;
    tls->field_0x160 = bVar7;
  }
  enc = &(tls->traffic_protection).enc;
  if ((bVar7 & 8) == 0) {
LAB_00115ddb:
    iVar4 = buffer_push_encrypted_records(sendbuf,'\x17',(uint8_t *)input,inlen,enc);
  }
  else {
    local_60.record_header_length = 5;
    local_60.begin_message = begin_record_message;
    local_60.commit_message = commit_record_message;
    local_38 = 0;
    sVar1 = sendbuf->off;
    local_60.buf = sendbuf;
    local_60.enc = enc;
    iVar4 = begin_record_message(&local_60);
    buf = local_60.buf;
    if (iVar4 == 0) {
      iVar4 = ptls_buffer_reserve(local_60.buf,1);
      if (iVar4 == 0) {
        buf->base[buf->off] = '\x18';
        buf->off = buf->off + 1;
        iVar4 = ptls_buffer_reserve(buf,3);
        if (iVar4 == 0) {
          puVar2 = buf->base;
          sVar3 = buf->off;
          puVar2[sVar3 + 2] = '\0';
          puVar2 = puVar2 + sVar3;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          sVar8 = buf->off;
          sVar3 = sVar8 + 3;
          buf->off = sVar3;
          iVar4 = ptls_buffer_reserve(buf,1);
          if (iVar4 == 0) {
            buf->base[buf->off] = bVar7 >> 4 & 1;
            sVar5 = buf->off + 1;
            buf->off = sVar5;
            lVar6 = 0x10;
            do {
              buf->base[sVar8] = (uint8_t)(sVar5 - sVar3 >> ((byte)lVar6 & 0x3f));
              lVar6 = lVar6 + -8;
              sVar8 = sVar8 + 1;
            } while (lVar6 != -8);
            iVar4 = (*local_60.commit_message)(&local_60);
            if (iVar4 == 0) {
              iVar4 = update_traffic_key(tls,1);
              if (iVar4 == 0) {
                tls->field_0x160 = tls->field_0x160 & 0xe7;
                goto LAB_00115ddb;
              }
            }
          }
        }
      }
    }
    (local_60.buf)->off = sVar1;
  }
  return iVar4;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t inlen)
{
    assert(tls->traffic_protection.enc.aead != NULL);

    /* "For AES-GCM, up to 2^24.5 full-size records (about 24 million) may be encrypted on a given connection while keeping a
     * safety margin of approximately 2^-57 for Authenticated Encryption (AE) security." (RFC 8446 section 5.5)
     */
    if (tls->traffic_protection.enc.seq >= 16777216)
        tls->needs_key_update = 1;

    if (tls->needs_key_update) {
        int ret;
        if ((ret = update_send_key(tls, sendbuf, tls->key_update_send_request)) != 0)
            return ret;
        tls->needs_key_update = 0;
        tls->key_update_send_request = 0;
    }

    return buffer_push_encrypted_records(sendbuf, PTLS_CONTENT_TYPE_APPDATA, input, inlen, &tls->traffic_protection.enc);
}